

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::logic_t_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::logic_t_const&> *this,logic_t *rhs)

{
  int iVar1;
  int iVar2;
  logic_t *value;
  ostream *poVar3;
  ostringstream os;
  allocator local_291;
  long *local_290;
  size_type local_288;
  long local_280;
  undefined8 uStack_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260 [8];
  undefined8 uStack_258;
  string local_250;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [8];
  undefined8 uStack_218;
  long *local_210;
  size_type local_208;
  long local_200;
  undefined8 uStack_1f8;
  string local_1f0;
  undefined1 local_1d0 [40];
  ostringstream local_1a8 [376];
  
  value = *(logic_t **)this;
  iVar1 = rhs->value;
  iVar2 = value->value;
  std::__cxx11::string::string((string *)&local_270,"==",&local_291);
  local_230 = local_220;
  if (local_270 == local_260) {
    uStack_218 = uStack_258;
  }
  else {
    local_230 = local_270;
  }
  local_228 = local_268;
  local_268 = 0;
  local_260[0] = 0;
  local_270 = local_260;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  to_string<(anonymous_namespace)::logic_t>(&local_250,value);
  poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_250);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)&local_230);
  poVar3 = std::operator<<(poVar3," ");
  to_string<(anonymous_namespace)::logic_t>(&local_1f0,rhs);
  std::operator<<(poVar3,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == &local_250.field_2) {
    uStack_278 = local_250.field_2._8_8_;
    local_290 = &local_280;
  }
  else {
    local_290 = (long *)local_250._M_dataplus._M_p;
  }
  local_280._1_7_ = local_250.field_2._M_allocated_capacity._1_7_;
  local_288 = local_250._M_string_length;
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  local_208 = local_288;
  local_210 = &local_200;
  if (local_290 == &local_280) {
    uStack_1f8 = uStack_278;
  }
  else {
    local_210 = local_290;
  }
  local_288 = 0;
  local_1d0[0] = iVar2 == iVar1;
  local_280 = (ulong)local_280._1_7_ << 8;
  local_290 = &local_280;
  std::__cxx11::string::string((string *)(local_1d0 + 8),(string *)&local_210);
  result::result(__return_storage_ptr__,(result *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_270);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }